

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptArrays.cpp
# Opt level: O0

void __thiscall
GlobOpt::ArraySrcOpt::InsertInstrInLandingPad(ArraySrcOpt *this,Instr *instr,Loop *hoistOutOfLoop)

{
  Instr *instr_00;
  Loop *hoistOutOfLoop_local;
  Instr *instr_local;
  ArraySrcOpt *this_local;
  
  if (hoistOutOfLoop->bailOutInfo->bailOutInstr == (Instr *)0x0) {
    instr_00 = BasicBlock::GetLastInstr(hoistOutOfLoop->landingPad);
    IR::Instr::SetByteCodeOffset(instr,instr_00);
    BasicBlock::InsertAfter(hoistOutOfLoop->landingPad,instr);
  }
  else {
    IR::Instr::SetByteCodeOffset(instr,hoistOutOfLoop->bailOutInfo->bailOutInstr);
    IR::Instr::InsertBefore(hoistOutOfLoop->bailOutInfo->bailOutInstr,instr);
  }
  return;
}

Assistant:

void GlobOpt::ArraySrcOpt::InsertInstrInLandingPad(IR::Instr *const instr, Loop *const hoistOutOfLoop)
{
    if (hoistOutOfLoop->bailOutInfo->bailOutInstr)
    {
        instr->SetByteCodeOffset(hoistOutOfLoop->bailOutInfo->bailOutInstr);
        hoistOutOfLoop->bailOutInfo->bailOutInstr->InsertBefore(instr);
    }
    else
    {
        instr->SetByteCodeOffset(hoistOutOfLoop->landingPad->GetLastInstr());
        hoistOutOfLoop->landingPad->InsertAfter(instr);
    }
}